

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O1

REF_STATUS ref_clump_tet_quality(REF_GRID_conflict ref_grid,REF_DBL min_quality,char *filename)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *pRVar1;
  REF_DICT pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  FILE *__s;
  long lVar5;
  REF_DBL RVar6;
  undefined8 uVar7;
  int cell;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  REF_INT local;
  REF_DICT ref_dict;
  REF_DBL quality;
  REF_INT nodes_1 [27];
  REF_INT nodes [27];
  REF_DICT local_140;
  int local_134;
  REF_DICT local_130;
  FILE *local_128;
  double local_120;
  REF_INT local_118 [28];
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  uVar3 = ref_dict_create(&local_130);
  if (uVar3 == 0) {
    ref_cell = ref_grid->cell[8];
    if (0 < ref_cell->max) {
      cell = 0;
      do {
        RVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
        if (RVar4 == 0) {
          uVar3 = ref_node_tet_quality(ref_node,local_a8,&local_120);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x22d,"ref_clump_tet_quality",(ulong)uVar3,"qual");
            return uVar3;
          }
          if ((local_120 < min_quality) && (uVar3 = ref_dict_store(local_130,cell,0), uVar3 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x22e,"ref_clump_tet_quality",(ulong)uVar3,"store");
            return uVar3;
          }
        }
        cell = cell + 1;
      } while (cell < ref_cell->max);
    }
    __s = fopen(filename,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x233
             ,"ref_clump_tet_quality","unable to open file");
      return 2;
    }
    fwrite("title=\"tecplot refine cell clump file\"\n",0x27,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
    pRVar2 = local_130;
    if (local_130->n < 1) {
      uVar3 = 0;
    }
    else {
      uVar3 = ref_dict_create(&local_140);
      if (uVar3 == 0) {
        uVar8 = (ulong)(uint)pRVar2->n;
        if (0 < pRVar2->n) {
          RVar6 = 0.0;
          local_128 = __s;
          do {
            __s = local_128;
            uVar3 = ref_cell_nodes(ref_cell,pRVar2->key[(long)RVar6],local_118);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x5d,"ref_clump_cell_zone",(ulong)uVar3,"n");
              goto LAB_001fc3d3;
            }
            min_quality = RVar6;
            if (0 < ref_cell->node_per) {
              lVar10 = 0;
              do {
                uVar3 = ref_dict_store(local_140,local_118[lVar10],0);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                         ,0x5f,"ref_clump_cell_zone",(ulong)uVar3,"store");
                  __s = local_128;
                  goto LAB_001fc3d3;
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 < ref_cell->node_per);
            }
            RVar6 = (REF_DBL)((long)min_quality + 1);
            uVar8 = (ulong)pRVar2->n;
            __s = local_128;
          } while ((long)RVar6 < (long)uVar8);
        }
        uVar3 = 0;
        fprintf(__s,"zone t=\"%s\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                "fetetrahedron",(ulong)(uint)local_140->n,uVar8,"point","fetetrahedron",
                (ulong)min_quality & 0xffffffff00000000);
        if (0 < local_140->n) {
          lVar10 = 0;
          do {
            local_134 = local_140->key[lVar10];
            lVar5 = (long)local_134;
            pRVar1 = ref_node->real;
            fprintf(__s," %.16e %.16e %.16e\n",pRVar1[lVar5 * 0xf],pRVar1[lVar5 * 0xf + 1],
                    pRVar1[lVar5 * 0xf + 2]);
            lVar10 = lVar10 + 1;
          } while (lVar10 < local_140->n);
        }
        if (0 < pRVar2->n) {
          lVar10 = 0;
          do {
            uVar3 = ref_cell_nodes(ref_cell,pRVar2->key[lVar10],local_118);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x6f,"ref_clump_cell_zone",(ulong)uVar3,"n");
              break;
            }
            if (0 < ref_cell->node_per) {
              lVar5 = 0;
              do {
                uVar3 = ref_dict_location(local_140,local_118[lVar5],&local_134);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                         ,0x71,"ref_clump_cell_zone",(ulong)uVar3,"ret");
                  goto LAB_001fc3d3;
                }
                fprintf(__s," %d",(ulong)(local_134 + 1));
                lVar5 = lVar5 + 1;
              } while (lVar5 < ref_cell->node_per);
            }
            fputc(10,__s);
            lVar10 = lVar10 + 1;
            uVar3 = 0;
          } while (lVar10 < pRVar2->n);
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x5a,"ref_clump_cell_zone",(ulong)uVar3,"create cell dict");
      }
    }
LAB_001fc3d3:
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x239
             ,"ref_clump_tet_quality",(ulong)uVar3,"zone");
      return uVar3;
    }
    fclose(__s);
    uVar3 = ref_dict_free(local_130);
    if (uVar3 == 0) {
      return 0;
    }
    pcVar9 = "free tet";
    uVar7 = 0x23d;
  }
  else {
    pcVar9 = "create cell dict";
    uVar7 = 0x229;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar7,
         "ref_clump_tet_quality",(ulong)uVar3,pcVar9);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_clump_tet_quality(REF_GRID ref_grid, REF_DBL min_quality,
                                         const char *filename) {
  REF_DICT ref_dict;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality;
  const char *zonetype;
  FILE *f;

  RSS(ref_dict_create(&ref_dict), "create cell dict");

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
    if (quality < min_quality) RSS(ref_dict_store(ref_dict, cell, 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine cell clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\"\n");

  zonetype = "fetetrahedron";
  RSS(ref_clump_cell_zone(f, ref_cell, ref_dict, zonetype, ref_node), "zone");

  fclose(f);

  RSS(ref_dict_free(ref_dict), "free tet");

  return REF_SUCCESS;
}